

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5WriteFlushLeaf(Fts5Index *p,Fts5SegWriter *pWriter)

{
  Fts5Buffer *pBuf;
  ushort uVar1;
  
  pBuf = &(pWriter->writer).buf;
  uVar1 = (ushort)(pWriter->writer).buf.n;
  *(ushort *)((pWriter->writer).buf.p + 2) = uVar1 << 8 | uVar1 >> 8;
  if (pWriter->bFirstTermInPage == '\0') {
    sqlite3Fts5BufferAppendBlob(&p->rc,pBuf,(pWriter->writer).pgidx.n,(pWriter->writer).pgidx.p);
  }
  else {
    if ((pWriter->bFirstRowidInPage != '\0') && (0 < (pWriter->aDlidx->buf).n)) {
      sqlite3Fts5BufferAppendVarint(&p->rc,&pWriter->aDlidx->buf,0);
    }
    pWriter->nEmpty = pWriter->nEmpty + 1;
  }
  fts5DataWrite(p,(long)(pWriter->writer).pgno + ((ulong)(uint)pWriter->iSegid << 0x25),
                (pWriter->writer).buf.p,(pWriter->writer).buf.n);
  (pWriter->writer).buf.n = 0;
  (pWriter->writer).pgidx.n = 0;
  sqlite3Fts5BufferAppendBlob(&p->rc,pBuf,4,"");
  (pWriter->writer).iPrevPgidx = 0;
  (pWriter->writer).pgno = (pWriter->writer).pgno + 1;
  pWriter->nLeafWritten = pWriter->nLeafWritten + 1;
  pWriter->bFirstRowidInPage = '\x01';
  pWriter->bFirstTermInPage = '\x01';
  return;
}

Assistant:

static void fts5WriteFlushLeaf(Fts5Index *p, Fts5SegWriter *pWriter){
  static const u8 zero[] = { 0x00, 0x00, 0x00, 0x00 };
  Fts5PageWriter *pPage = &pWriter->writer;
  i64 iRowid;

  assert( (pPage->pgidx.n==0)==(pWriter->bFirstTermInPage) );

  /* Set the szLeaf header field. */
  assert( 0==fts5GetU16(&pPage->buf.p[2]) );
  fts5PutU16(&pPage->buf.p[2], (u16)pPage->buf.n);

  if( pWriter->bFirstTermInPage ){
    /* No term was written to this page. */
    assert( pPage->pgidx.n==0 );
    fts5WriteBtreeNoTerm(p, pWriter);
  }else{
    /* Append the pgidx to the page buffer. Set the szLeaf header field. */
    fts5BufferAppendBlob(&p->rc, &pPage->buf, pPage->pgidx.n, pPage->pgidx.p);
  }

  /* Write the page out to disk */
  iRowid = FTS5_SEGMENT_ROWID(pWriter->iSegid, pPage->pgno);
  fts5DataWrite(p, iRowid, pPage->buf.p, pPage->buf.n);

  /* Initialize the next page. */
  fts5BufferZero(&pPage->buf);
  fts5BufferZero(&pPage->pgidx);
  fts5BufferAppendBlob(&p->rc, &pPage->buf, 4, zero);
  pPage->iPrevPgidx = 0;
  pPage->pgno++;

  /* Increase the leaves written counter */
  pWriter->nLeafWritten++;

  /* The new leaf holds no terms or rowids */
  pWriter->bFirstTermInPage = 1;
  pWriter->bFirstRowidInPage = 1;
}